

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage3d_max_level
               (NegativeTestContext *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  RenderContext *pRVar4;
  ContextInfo *this;
  allocator<char> local_b1;
  string local_b0;
  deUint32 local_8c;
  ContextType local_88;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  GLuint local_28;
  GLuint local_24;
  deUint32 textures [3];
  deUint32 log2MaxCubeMapTextureSize;
  deUint32 log2MaxTextureSize;
  deUint32 log2Max3DTextureSize;
  NegativeTestContext *ctx_local;
  
  iVar2 = NegativeTestContext::getInteger(ctx,0x8073);
  iVar2 = ::deLog2Floor32(iVar2);
  iVar3 = NegativeTestContext::getInteger(ctx,0xd33);
  iVar3 = ::deLog2Floor32(iVar3);
  textures[2] = iVar3 + 1;
  iVar3 = NegativeTestContext::getInteger(ctx,0x851c);
  iVar3 = ::deLog2Floor32(iVar3);
  textures[1] = iVar3 + 1;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,3,&local_28);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_28);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,local_24);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_3D_TEXTURE_SIZE)."
             ,&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&ctx->super_CallLogWrapper,0x806f,iVar2 + 1,0,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).",
             &local_81);
  NegativeTestContext::beginSection(ctx,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,textures[2],0,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  pRVar4 = NegativeTestContext::getRenderContext(ctx);
  local_88.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_8c = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_88,(ApiType)local_8c);
  if (!bVar1) {
    this = NegativeTestContext::getContextInfo(ctx);
    bVar1 = glu::ContextInfo::isExtensionSupported(this,"GL_OES_texture_cube_map_array");
    if (!bVar1) goto LAB_022d12a8;
  }
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,textures[0]);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x9009,0,0x1908,4,4,6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_TEXTURE_SIZE)."
             ,&local_b1);
  NegativeTestContext::beginSection(ctx,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  glu::CallLogWrapper::glCopyTexSubImage3D
            (&ctx->super_CallLogWrapper,0x9009,textures[1],0,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
LAB_022d12a8:
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,3,&local_28);
  return;
}

Assistant:

void copytexsubimage3d_max_level (NegativeTestContext& ctx)
{
	deUint32	log2Max3DTextureSize		= deLog2Floor32(ctx.getInteger(GL_MAX_3D_TEXTURE_SIZE)) + 1;
	deUint32	log2MaxTextureSize			= deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;
	deUint32	log2MaxCubeMapTextureSize	= deLog2Floor32(ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE)) + 1;

	deUint32	textures[3];
	ctx.glGenTextures(3, &textures[0]);
	ctx.glBindTexture(GL_TEXTURE_3D, textures[0]);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, textures[1]);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_3D_TEXTURE_SIZE).");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_3D, log2Max3DTextureSize, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).");
	ctx.glCopyTexSubImage3D(GL_TEXTURE_2D_ARRAY, log2MaxTextureSize, 0, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[2]);
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, 4, 4, 6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_NO_ERROR);
		ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_TEXTURE_SIZE).");
		ctx.glCopyTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxCubeMapTextureSize, 0, 0, 0, 0, 0, 4, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();
	}

	ctx.glDeleteTextures(3, &textures[0]);
}